

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int stream_obq_push(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  uint64_t uVar1;
  int iVar2;
  bool bVar3;
  nghttp2_stream *pnStack_20;
  int rv;
  nghttp2_stream *stream_local;
  nghttp2_stream *dep_stream_local;
  
  pnStack_20 = stream;
  stream_local = dep_stream;
  while( true ) {
    bVar3 = false;
    if (stream_local != (nghttp2_stream *)0x0) {
      bVar3 = pnStack_20->queued == '\0';
    }
    if (!bVar3) break;
    stream_next_cycle(pnStack_20,stream_local->descendant_last_cycle);
    uVar1 = stream_local->descendant_next_seq;
    stream_local->descendant_next_seq = uVar1 + 1;
    pnStack_20->seq = uVar1;
    iVar2 = nghttp2_pq_push(&stream_local->obq,&pnStack_20->pq_entry);
    if (iVar2 != 0) {
      return iVar2;
    }
    pnStack_20->queued = '\x01';
    pnStack_20 = stream_local;
    stream_local = stream_local->dep_prev;
  }
  return 0;
}

Assistant:

static int stream_obq_push(nghttp2_stream *dep_stream, nghttp2_stream *stream) {
  int rv;

  for (; dep_stream && !stream->queued;
       stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    stream_next_cycle(stream, dep_stream->descendant_last_cycle);
    stream->seq = dep_stream->descendant_next_seq++;

    DEBUGF("stream: stream=%d obq push cycle=%lu\n", stream->stream_id,
           stream->cycle);

    DEBUGF("stream: push stream %d to stream %d\n", stream->stream_id,
           dep_stream->stream_id);

    rv = nghttp2_pq_push(&dep_stream->obq, &stream->pq_entry);
    if (rv != 0) {
      return rv;
    }
    stream->queued = 1;
  }

  return 0;
}